

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_utils.hpp
# Opt level: O0

string * PlatformUtilsGetSecureEnv_abi_cxx11_(string *__return_storage_ptr__,char *name)

{
  char *pcVar1;
  byte local_111;
  allocator local_fa;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  byte local_55;
  byte local_42;
  allocator local_41;
  string local_40 [32];
  char *local_20;
  char *str;
  char *name_local;
  
  str = name;
  name_local = (char *)__return_storage_ptr__;
  pcVar1 = detail::ImplGetSecureEnv(name);
  local_20 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = detail::ImplGetEnv(str);
    local_42 = 0;
    local_55 = 0;
    local_111 = 0;
    local_20 = pcVar1;
    if (pcVar1 != (char *)0x0) {
      std::allocator<char>::allocator();
      local_42 = 1;
      std::__cxx11::string::string(local_40,pcVar1,&local_41);
      local_55 = 1;
      local_111 = std::__cxx11::string::empty();
      local_111 = local_111 ^ 0xff;
    }
    if ((local_55 & 1) != 0) {
      std::__cxx11::string::~string(local_40);
    }
    if ((local_42 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    if ((local_111 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f8,"!!! WARNING !!! Environment variable ",&local_f9);
      std::operator+(&local_d8,&local_f8,str);
      std::operator+(&local_b8,&local_d8,
                     " is being ignored due to running with secure execution. The value \'");
      std::operator+(&local_98,&local_b8,local_20);
      std::operator+(&local_78,&local_98,"\' will NOT be used.");
      LogPlatformUtilsError(&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_fa);
    std::allocator<char>::~allocator((allocator<char> *)&local_fa);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline std::string PlatformUtilsGetSecureEnv(const char* name) {
    auto str = detail::ImplGetSecureEnv(name);
    if (str == nullptr) {
        str = detail::ImplGetEnv(name);
        if (str != nullptr && !std::string(str).empty()) {
            LogPlatformUtilsError(std::string("!!! WARNING !!! Environment variable ") + name +
                                  " is being ignored due to running with secure execution. The value '" + str +
                                  "' will NOT be used.");
        }
        return {};
    }
    return str;
}